

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

void __thiscall
google::protobuf::TextFormat::Printer::Print
          (Printer *this,Message *message,TextGenerator *generator)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int i;
  ulong uVar2;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_48;
  Reflection *reflection;
  
  iVar1 = (*(message->super_MessageLite)._vptr_MessageLite[0x12])(message);
  reflection = (Reflection *)CONCAT44(extraout_var,iVar1);
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*reflection->_vptr_Reflection[0xc])(reflection,message);
  uVar2 = 0;
  while( true ) {
    if ((ulong)((long)local_48._M_impl.super__Vector_impl_data._M_finish -
                (long)local_48._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar2) break;
    PrintField(this,message,reflection,local_48._M_impl.super__Vector_impl_data._M_start[uVar2],
               generator);
    uVar2 = uVar2 + 1;
  }
  iVar1 = (*reflection->_vptr_Reflection[2])(reflection,message);
  PrintUnknownFields(this,(UnknownFieldSet *)CONCAT44(extraout_var_00,iVar1),generator);
  std::
  _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~_Vector_base(&local_48);
  return;
}

Assistant:

void TextFormat::Printer::Print(const Message& message,
                                TextGenerator& generator) const {
  const Reflection* reflection = message.GetReflection();
  vector<const FieldDescriptor*> fields;
  reflection->ListFields(message, &fields);
  for (int i = 0; i < fields.size(); i++) {
    PrintField(message, reflection, fields[i], generator);
  }
  PrintUnknownFields(reflection->GetUnknownFields(message), generator);
}